

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

void __thiscall
EquationCat::genPattern(EquationCat *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern TStack_38;
  
  (*this->left->_vptr_PatternEquation[2])();
  (*this->right->_vptr_PatternEquation[2])(this->right,ops);
  TokenPattern::doCat(&TStack_38,&this->left->resultpattern,&this->right->resultpattern);
  TokenPattern::operator=(&(this->super_PatternEquation).resultpattern,&TStack_38);
  TokenPattern::~TokenPattern(&TStack_38);
  return;
}

Assistant:

void EquationCat::genPattern(const vector<TokenPattern> &ops) const

{
  left->genPattern(ops);
  right->genPattern(ops);
  resultpattern = left->getTokenPattern().doCat(right->getTokenPattern());
}